

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMutableRenderBufferTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::anon_unknown_3::MutableRenderBufferTest::init
          (MutableRenderBufferTest *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *this_00;
  Library *pLVar1;
  bool bVar2;
  Visibility visibility_;
  int iVar3;
  deUint32 dVar4;
  deBool dVar5;
  ApiType apiType;
  int extraout_EAX;
  NativeDisplay *pNVar6;
  EGLDisplay pvVar7;
  EGLConfig pvVar8;
  reference ppvVar9;
  NotSupportedError *pNVar10;
  NativeDisplayFactory *factory_00;
  CommandLine *pCVar11;
  NativeWindowFactory *pNVar12;
  undefined4 extraout_var;
  EGLSurface pvVar13;
  undefined4 extraout_var_00;
  TestError *this_01;
  undefined8 local_118;
  EGLint contextAttribList [3];
  NativeWindowFactory *factory;
  const_iterator cStack_f0;
  EGLint surfaceType;
  __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_> local_e8;
  const_iterator config;
  vector<void_*,_std::allocator<void_*>_> configs;
  EGLint attribsNoBit [13];
  EGLint local_88 [2];
  EGLint attribs [13];
  allocator<char> local_39;
  string local_38;
  Library *local_18;
  Library *egl;
  MutableRenderBufferTest *this_local;
  
  egl = (Library *)this;
  local_18 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pNVar6 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar7 = eglu::getAndInitDisplay(pNVar6,(Version *)0x0);
  pLVar1 = local_18;
  this->m_eglDisplay = pvVar7;
  pvVar7 = this->m_eglDisplay;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"EGL_KHR_mutable_render_buffer",&local_39);
  bVar2 = eglu::hasExtension(pLVar1,pvVar7,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar10,"EGL_KHR_mutable_render_buffer is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
               ,100);
    __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  memcpy(local_88,&DAT_02b52760,0x34);
  memcpy(&configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,&DAT_02b527a0,0x34);
  if ((this->m_enableConfigBit & 1U) == 0) {
    eglu::chooseConfigs((vector<void_*,_std::allocator<void_*>_> *)&config,local_18,
                        this->m_eglDisplay,
                        (EGLint *)
                        &configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    local_e8._M_current =
         (void **)std::vector<void_*,_std::allocator<void_*>_>::begin
                            ((vector<void_*,_std::allocator<void_*>_> *)&config);
    while( true ) {
      cStack_f0 = std::vector<void_*,_std::allocator<void_*>_>::end
                            ((vector<void_*,_std::allocator<void_*>_> *)&config);
      bVar2 = __gnu_cxx::operator!=(&local_e8,&stack0xffffffffffffff10);
      if (!bVar2) break;
      factory._4_4_ = 0xffffffff;
      do {
        pLVar1 = local_18;
        pvVar7 = this->m_eglDisplay;
        ppvVar9 = __gnu_cxx::
                  __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
                  operator*(&local_e8);
        (*pLVar1->_vptr_Library[0x19])(pLVar1,pvVar7,*ppvVar9,0x3033,(long)&factory + 4);
        dVar4 = (*local_18->_vptr_Library[0x1f])();
        eglu::checkError(dVar4,
                         "getConfigAttrib(m_eglDisplay, *config, EGL_SURFACE_TYPE, &surfaceType)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                         ,0x88);
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      if ((factory._4_4_ & 0x1000) == 0) {
        ppvVar9 = __gnu_cxx::
                  __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
                  operator*(&local_e8);
        this->m_eglConfig = *ppvVar9;
        break;
      }
      __gnu_cxx::__normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
      operator++(&local_e8);
    }
    if (this->m_eglConfig == (EGLConfig)0x0) {
      pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar10,"No config without support for mutable_render_buffer found",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                 ,0x92);
      __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    std::vector<void_*,_std::allocator<void_*>_>::~vector
              ((vector<void_*,_std::allocator<void_*>_> *)&config);
  }
  else {
    pvVar8 = eglu::chooseSingleConfig(local_18,this->m_eglDisplay,local_88);
    this->m_eglConfig = pvVar8;
  }
  factory_00 = EglTestContext::getNativeDisplayFactory((this->super_TestCase).m_eglTestCtx);
  pCVar11 = tcu::TestContext::getCommandLine
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pNVar12 = eglu::selectNativeWindowFactory(factory_00,pCVar11);
  pNVar6 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar7 = this->m_eglDisplay;
  pvVar8 = this->m_eglConfig;
  pCVar11 = tcu::TestContext::getCommandLine
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  visibility_ = eglu::parseWindowVisibility(pCVar11);
  eglu::WindowParams::WindowParams((WindowParams *)(contextAttribList + 1),0x1e0,0x1e0,visibility_);
  iVar3 = (*(pNVar12->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar12,pNVar6,pvVar7,pvVar8,0,contextAttribList + 1);
  this->m_window = (NativeWindow *)CONCAT44(extraout_var,iVar3);
  pNVar6 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar13 = eglu::createWindowSurface
                      (pNVar6,this->m_window,this->m_eglDisplay,this->m_eglConfig,(EGLAttrib *)0x0);
  this->m_eglSurface = pvVar13;
  local_118 = 0x200003098;
  contextAttribList[0] = 0x3038;
  (**local_18->_vptr_Library)(local_18,0x30a0);
  iVar3 = (*local_18->_vptr_Library[6])(local_18,this->m_eglDisplay,this->m_eglConfig,0,&local_118);
  this->m_eglContext = (EGLContext)CONCAT44(extraout_var_00,iVar3);
  dVar4 = (*local_18->_vptr_Library[0x1f])();
  eglu::checkError(dVar4,"eglCreateContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                   ,0xa4);
  while ((dVar5 = ::deGetFalse(), dVar5 == 0 && (this->m_eglSurface != (EGLSurface)0x0))) {
    dVar5 = ::deGetFalse();
    if (dVar5 == 0) {
      (*local_18->_vptr_Library[0x27])
                (local_18,this->m_eglDisplay,this->m_eglSurface,this->m_eglSurface,
                 this->m_eglContext);
      dVar4 = (*local_18->_vptr_Library[0x1f])();
      eglu::checkError(dVar4,"eglMakeCurrent",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                       ,0xa7);
      this_00 = (this->super_TestCase).m_eglTestCtx;
      apiType = glu::ApiType::es(2,0);
      EglTestContext::initGLFunctions(this_00,&this->m_gl,apiType);
      return extraout_EAX;
    }
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"m_eglSurface != EGL_NO_SURFACE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
             ,0xa5);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void MutableRenderBufferTest::init (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	// create display
	m_eglDisplay		= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());

	if (!eglu::hasExtension(egl, m_eglDisplay, "EGL_KHR_mutable_render_buffer"))
	{
		TCU_THROW(NotSupportedError, "EGL_KHR_mutable_render_buffer is not supported");
	}

	// get mutable render buffer config
	const EGLint	attribs[]	=
	{
        EGL_RED_SIZE,			8,
        EGL_GREEN_SIZE,			8,
        EGL_BLUE_SIZE,			8,
		EGL_ALPHA_SIZE,			8,
		EGL_SURFACE_TYPE,		EGL_WINDOW_BIT | EGL_MUTABLE_RENDER_BUFFER_BIT_KHR,
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_NONE
	};
	const EGLint	attribsNoBit[]	=
	{
        EGL_RED_SIZE,			8,
        EGL_GREEN_SIZE,			8,
        EGL_BLUE_SIZE,			8,
		EGL_ALPHA_SIZE,			8,
		EGL_SURFACE_TYPE,		EGL_WINDOW_BIT,
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_NONE
	};

	if (m_enableConfigBit)
	{
		m_eglConfig = eglu::chooseSingleConfig(egl, m_eglDisplay, attribs);
	}
	else
	{
		const vector<EGLConfig> configs = eglu::chooseConfigs(egl, m_eglDisplay, attribsNoBit);

		for (vector<EGLConfig>::const_iterator config = configs.begin(); config != configs.end(); ++config)
		{
			EGLint surfaceType = -1;
			EGLU_CHECK_CALL(egl, getConfigAttrib(m_eglDisplay, *config, EGL_SURFACE_TYPE, &surfaceType));

			if (!(surfaceType & EGL_MUTABLE_RENDER_BUFFER_BIT_KHR))
			{
				m_eglConfig = *config;
				break;
			}
		}

		if (m_eglConfig == DE_NULL)
			TCU_THROW(NotSupportedError, "No config without support for mutable_render_buffer found");
	}

	// create surface
	const eglu::NativeWindowFactory& factory = eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());
	m_window = factory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_eglDisplay, m_eglConfig, DE_NULL,
									eglu::WindowParams(480, 480, eglu::parseWindowVisibility(m_testCtx.getCommandLine())));
	m_eglSurface = eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *m_window, m_eglDisplay, m_eglConfig, DE_NULL);

	// create context and make current
	const EGLint	contextAttribList[]	=
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};

	egl.bindAPI(EGL_OPENGL_ES_API);
	m_eglContext = egl.createContext(m_eglDisplay, m_eglConfig, EGL_NO_CONTEXT, contextAttribList);
	EGLU_CHECK_MSG(egl, "eglCreateContext");
	TCU_CHECK(m_eglSurface != EGL_NO_SURFACE);
	egl.makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext);
	EGLU_CHECK_MSG(egl, "eglMakeCurrent");

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));
}